

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NextColumn(void)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumnsSet *pIVar4;
  ImGuiColumnsSet *pIVar5;
  ImGuiColumnData *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  ImGuiContext *g;
  uint uVar11;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if ((pIVar3->SkipItems == false) && ((pIVar3->DC).ColumnsSet != (ImGuiColumnsSet *)0x0)) {
    pIVar3->WriteAccessed = true;
    iVar2 = (pIVar3->DC).ItemWidthStack.Size;
    iVar8 = iVar2 + -1;
    (pIVar3->DC).ItemWidthStack.Size = iVar8;
    if (iVar8 == 0) {
      pfVar9 = &pIVar3->ItemWidthDefault;
    }
    else {
      pfVar9 = (pIVar3->DC).ItemWidthStack.Data + (long)iVar2 + -2;
    }
    (pIVar3->DC).ItemWidth = *pfVar9;
    PopClipRect();
    pIVar4 = (pIVar3->DC).ColumnsSet;
    fVar1 = (pIVar3->DC).CursorPos.y;
    uVar11 = -(uint)(fVar1 <= pIVar4->LineMaxY);
    pIVar4->LineMaxY = (float)(~uVar11 & (uint)fVar1 | (uint)pIVar4->LineMaxY & uVar11);
    iVar8 = pIVar4->Current;
    iVar2 = iVar8 + 1;
    pIVar4->Current = iVar2;
    if (iVar2 < pIVar4->Count) {
      pIVar5 = (GImGui->CurrentWindow->DC).ColumnsSet;
      iVar10 = iVar2;
      if (iVar8 < -1) {
        iVar10 = pIVar5->Current;
      }
      (pIVar3->DC).ColumnsOffset.x =
           (((pIVar5->MaxX - pIVar5->MinX) * (pIVar5->Columns).Data[iVar10].OffsetNorm +
            pIVar5->MinX) - (pIVar3->DC).Indent.x) + (pIVar7->Style).ItemSpacing.x;
      ImDrawList::ChannelsSetCurrent(pIVar3->DrawList,iVar2);
    }
    else {
      (pIVar3->DC).ColumnsOffset.x = 0.0;
      ImDrawList::ChannelsSetCurrent(pIVar3->DrawList,0);
      pIVar4->Current = 0;
      pIVar4->LineMinY = pIVar4->LineMaxY;
    }
    (pIVar3->DC).CursorPos.x =
         (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
    (pIVar3->DC).CursorPos.y = pIVar4->LineMinY;
    (pIVar3->DC).CurrentLineSize.x = 0.0;
    (pIVar3->DC).CurrentLineSize.y = 0.0;
    (pIVar3->DC).CurrentLineTextBaseOffset = 0.0;
    pIVar4 = (GImGui->CurrentWindow->DC).ColumnsSet;
    iVar2 = pIVar4->Current;
    pIVar6 = (pIVar4->Columns).Data;
    PushClipRect(&pIVar6[iVar2].ClipRect.Min,&pIVar6[iVar2].ClipRect.Max,false);
    pIVar4 = (GImGui->CurrentWindow->DC).ColumnsSet;
    pIVar6 = (pIVar4->Columns).Data;
    PushItemWidth((pIVar4->MaxX - pIVar4->MinX) *
                  (pIVar6[(long)pIVar4->Current + 1].OffsetNorm - pIVar6[pIVar4->Current].OffsetNorm
                  ) * 0.65);
    return;
  }
  return;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = toupper(*str2) - toupper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}